

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int set_image_col_types(ParseData *lParse,fitsfile *fptr,char *name,int bitpix,DataInfo *varInfo,
                       iteratorCol *colIter)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RDX;
  long in_RDI;
  long in_R8;
  long in_R9;
  char temp [80];
  double tzero;
  double tscale;
  int istatus;
  char local_a8 [8];
  int *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  double local_50;
  double local_48;
  
  if ((in_ECX != 0xffffffc0) && (in_ECX != 0xffffffe0)) {
    if ((in_ECX == 8) || ((in_ECX == 0x10 || (in_ECX == 0x20)))) {
      iVar1 = ffgky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (iVar1 != 0) {
        local_50 = 0.0;
      }
      iVar1 = ffgky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (iVar1 != 0) {
        local_48 = 1.0;
      }
      if (((local_48 == 1.0) && (!NAN(local_48))) &&
         (((local_50 == 0.0 && (!NAN(local_50))) || ((local_50 == 32768.0 && (!NAN(local_50))))))) {
        *(undefined4 *)(in_R8 + 0x54) = 0x103;
        *(undefined4 *)(in_R9 + 0x54) = 0x29;
        return 0;
      }
      *(undefined4 *)(in_R8 + 0x54) = 0x104;
      *(undefined4 *)(in_R9 + 0x54) = 0x52;
      if (DEBUG_PIXFILTER == 0) {
        return 0;
      }
      printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",local_48,local_50,in_RDX);
      return 0;
    }
    if (in_ECX != 0x40) {
      snprintf(local_a8,0x50,"set_image_col_types: unrecognized image bitpix [%d]\n",(ulong)in_ECX);
      ffpmsg((char *)0x13bf14);
      *(undefined4 *)(in_RDI + 0xe0) = 0x1b0;
      return 0x1b0;
    }
  }
  *(undefined4 *)(in_R8 + 0x54) = 0x104;
  *(undefined4 *)(in_R9 + 0x54) = 0x52;
  return 0;
}

Assistant:

static int set_image_col_types (ParseData *lParse,
				fitsfile * fptr, const char * name, int bitpix,
				DataInfo * varInfo, iteratorCol *colIter) {

   int istatus;
   double tscale, tzero;
   char temp[80];

   switch (bitpix) {
      case BYTE_IMG:
      case SHORT_IMG:
      case LONG_IMG:
         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BZERO", &tzero, NULL, &istatus))
            tzero = 0.0;

         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BSCALE", &tscale, NULL, &istatus))
            tscale = 1.0;

         if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
            varInfo->type     = LONG;
            colIter->datatype = TLONG;
         }
         else {
            varInfo->type     = DOUBLE;
            colIter->datatype = TDOUBLE;
            if (DEBUG_PIXFILTER)
                printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",
                        name, tscale, tzero);
         }
         break;

      case LONGLONG_IMG:
      case FLOAT_IMG:
      case DOUBLE_IMG:
         varInfo->type     = DOUBLE;
         colIter->datatype = TDOUBLE;
         break;
      default:
         snprintf(temp, 80,"set_image_col_types: unrecognized image bitpix [%d]\n",
                bitpix);
         ffpmsg(temp);
         return lParse->status = PARSE_BAD_TYPE;
   }
   return 0;
}